

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::replaceFieldTypes
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,UnicodeString *skeleton,UDateTimePatternMatchOptions options,
          UErrorCode *status)

{
  PtnSkeleton local_b0;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->internalErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      local_b0._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_00479898;
      local_b0.original.chars[0] = '\0';
      local_b0.original.chars[1] = '\0';
      local_b0.original.chars[2] = '\0';
      local_b0.original.chars[3] = '\0';
      local_b0.original.chars[4] = '\0';
      local_b0.original.chars[5] = '\0';
      local_b0.original.chars[6] = '\0';
      local_b0.original.chars[7] = '\0';
      local_b0.original.chars[8] = '\0';
      local_b0.original.chars[9] = '\0';
      local_b0.original.chars[10] = '\0';
      local_b0.original.chars[0xb] = '\0';
      local_b0.original.chars[0xc] = '\0';
      local_b0.original.chars[0xd] = '\0';
      local_b0.original.chars[0xe] = '\0';
      local_b0.original.chars[0xf] = '\0';
      local_b0.original.lengths[0] = '\0';
      local_b0.original.lengths[1] = '\0';
      local_b0.original.lengths[2] = '\0';
      local_b0.original.lengths[3] = '\0';
      local_b0.original.lengths[4] = '\0';
      local_b0.original.lengths[5] = '\0';
      local_b0.original.lengths[6] = '\0';
      local_b0.original.lengths[7] = '\0';
      local_b0.original.lengths[8] = '\0';
      local_b0.original.lengths[9] = '\0';
      local_b0.original.lengths[10] = '\0';
      local_b0.original.lengths[0xb] = '\0';
      local_b0.original.lengths[0xc] = '\0';
      local_b0.original.lengths[0xd] = '\0';
      local_b0.original.lengths[0xe] = '\0';
      local_b0.original.lengths[0xf] = '\0';
      local_b0.baseOriginal.chars[0] = '\0';
      local_b0.baseOriginal.chars[1] = '\0';
      local_b0.baseOriginal.chars[2] = '\0';
      local_b0.baseOriginal.chars[3] = '\0';
      local_b0.baseOriginal.chars[4] = '\0';
      local_b0.baseOriginal.chars[5] = '\0';
      local_b0.baseOriginal.chars[6] = '\0';
      local_b0.baseOriginal.chars[7] = '\0';
      local_b0.baseOriginal.chars[8] = '\0';
      local_b0.baseOriginal.chars[9] = '\0';
      local_b0.baseOriginal.chars[10] = '\0';
      local_b0.baseOriginal.chars[0xb] = '\0';
      local_b0.baseOriginal.chars[0xc] = '\0';
      local_b0.baseOriginal.chars[0xd] = '\0';
      local_b0.baseOriginal.chars[0xe] = '\0';
      local_b0.baseOriginal.chars[0xf] = '\0';
      local_b0.baseOriginal.lengths[0] = '\0';
      local_b0.baseOriginal.lengths[1] = '\0';
      local_b0.baseOriginal.lengths[2] = '\0';
      local_b0.baseOriginal.lengths[3] = '\0';
      local_b0.baseOriginal.lengths[4] = '\0';
      local_b0.baseOriginal.lengths[5] = '\0';
      local_b0.baseOriginal.lengths[6] = '\0';
      local_b0.baseOriginal.lengths[7] = '\0';
      local_b0.baseOriginal.lengths[8] = '\0';
      local_b0.baseOriginal.lengths[9] = '\0';
      local_b0.baseOriginal.lengths[10] = '\0';
      local_b0.baseOriginal.lengths[0xb] = '\0';
      local_b0.baseOriginal.lengths[0xc] = '\0';
      local_b0.baseOriginal.lengths[0xd] = '\0';
      local_b0.baseOriginal.lengths[0xe] = '\0';
      local_b0.baseOriginal.lengths[0xf] = '\0';
      DateTimeMatcher::set(this->dtMatcher,skeleton,this->fp,&local_b0);
      adjustFieldTypes(__return_storage_ptr__,this,pattern,(PtnSkeleton *)0x0,0,options);
      return __return_storage_ptr__;
    }
    *status = this->internalErrorCode;
  }
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::replaceFieldTypes(const UnicodeString& pattern,
                                            const UnicodeString& skeleton,
                                            UDateTimePatternMatchOptions options,
                                            UErrorCode& status) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    if (U_FAILURE(internalErrorCode)) {
        status = internalErrorCode;
        return UnicodeString();
    }
    dtMatcher->set(skeleton, fp);
    UnicodeString result = adjustFieldTypes(pattern, nullptr, kDTPGNoFlags, options);
    return result;
}